

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BaseFab.H
# Opt level: O0

void __thiscall
amrex::BaseFab<int>::setComplement<(amrex::RunOn)1>
          (BaseFab<int> *this,int *x,Box *bx,DestComp dcomp,NumComps ncomp)

{
  bool bVar1;
  __normal_iterator<const_amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
  *in_RDI;
  Box *b;
  const_iterator __end3;
  const_iterator __begin3;
  BoxList *__range3;
  BoxList b_lst;
  BoxList *in_stack_ffffffffffffff88;
  __normal_iterator<const_amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
  in_stack_ffffffffffffffb0;
  Box *in_stack_ffffffffffffffb8;
  
  boxDiff(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0._M_current);
  BoxList::begin(in_stack_ffffffffffffff88);
  BoxList::end(in_stack_ffffffffffffff88);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_RDI,(__normal_iterator<const_amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                               *)in_stack_ffffffffffffff88);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>::
    operator*((__normal_iterator<const_amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
               *)&stack0xffffffffffffffb0);
    setVal<(amrex::RunOn)1>
              ((BaseFab<int> *)
               b_lst.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
               super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
               super__Vector_impl_data._M_start,(int *)__range3,__begin3._M_current,
               b_lst.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
               super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
               super__Vector_impl_data._M_finish._4_4_,
               b_lst.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
               super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
               super__Vector_impl_data._M_finish._0_4_);
    __gnu_cxx::
    __normal_iterator<const_amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>::
    operator++((__normal_iterator<const_amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                *)&stack0xffffffffffffffb0);
  }
  BoxList::~BoxList((BoxList *)0x16a146a);
  return;
}

Assistant:

void
BaseFab<T>::setComplement (T const& x, const Box& bx, DestComp dcomp, NumComps ncomp) noexcept
{
#ifdef AMREX_USE_GPU
    if (run_on == RunOn::Device && Gpu::inLaunchRegion()) {
        Array4<T> const& a = this->array();
        amrex::ParallelFor(this->domain, [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
        {
            if (! bx.contains(IntVect(AMREX_D_DECL(i,j,k)))) {
                for (int n = dcomp.i; n < ncomp.n+dcomp.i; ++n) {
                    a(i,j,k,n) = x;
                }
            }
        });
    } else
#endif
    {
        const BoxList b_lst = amrex::boxDiff(this->domain,bx);
        for (auto const& b : b_lst) {
            this->setVal<RunOn::Host>(x, b, dcomp, ncomp);
        }
    }
}